

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O3

int Saig_ManAddUniqueness
              (sat_solver *pSat,Vec_Int_t *vState,int nRegs,int i,int k,int *pnSatVarNum,
              int *pnClauses,int fVerbose)

{
  int iVarB;
  int iVarC;
  int *piVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  ulong uVar5;
  lit *begin;
  int iVar6;
  uint uVar7;
  char *__s;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar12;
  
  if (((k <= i) || (i == 0)) || (k == 0)) {
    __assert_fail("i && k && i < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x60,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  iVar8 = k * nRegs;
  if (vState->nSize < iVar8) {
    __assert_fail("nRegs * k <= Vec_IntSize(vState)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x61,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  if (nRegs < 1) {
    iVar9 = *pnSatVarNum;
  }
  else {
    piVar1 = vState->pArray;
    iVar6 = i * nRegs;
    uVar5 = 0;
    do {
      if ((-1 < piVar1[(long)iVar6 + uVar5]) && (piVar1[(long)iVar8 + uVar5] == -1)) {
        iVar8 = 0;
        if (fVerbose == 0) {
          return 0;
        }
        __s = "Cannot constrain an incomplete state.";
        goto LAB_00629361;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)nRegs != uVar5);
    iVar9 = *pnSatVarNum;
    if (0 < nRegs) {
      uVar5 = 0;
      do {
        if (-1 < piVar1[(long)iVar6 + uVar5]) {
          *pnClauses = *pnClauses + 4;
          iVar3 = piVar1[(long)iVar6 + uVar5];
          iVarB = piVar1[(long)iVar8 + uVar5];
          iVarC = *pnSatVarNum;
          *pnSatVarNum = iVarC + 1;
          iVar3 = Cnf_DataAddXorClause(pSat,iVar3,iVarB,iVarC);
          if (iVar3 == 0) goto joined_r0x00629358;
        }
        uVar5 = uVar5 + 1;
      } while ((uint)nRegs != uVar5);
    }
  }
  *pnClauses = *pnClauses + 1;
  begin = (lit *)malloc((long)nRegs << 2);
  auVar2 = _DAT_007ee2e0;
  uVar4 = *pnSatVarNum - iVar9;
  uVar7 = 0;
  if (uVar4 != 0 && iVar9 <= *pnSatVarNum) {
    lVar12 = (ulong)uVar4 - 1;
    auVar10._8_4_ = (int)lVar12;
    auVar10._0_8_ = lVar12;
    auVar10._12_4_ = (int)((ulong)lVar12 >> 0x20);
    iVar9 = iVar9 * 2;
    uVar5 = 0;
    auVar10 = auVar10 ^ _DAT_007ee2e0;
    auVar11 = _DAT_007ee2c0;
    auVar13 = _DAT_007ee2d0;
    do {
      auVar14 = auVar13 ^ auVar2;
      iVar8 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar8 && auVar10._0_4_ < auVar14._0_4_ || iVar8 < auVar14._4_4_)
                & 1)) {
        begin[uVar5] = iVar9;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        begin[uVar5 + 1] = iVar9 + 2;
      }
      auVar14 = auVar11 ^ auVar2;
      iVar6 = auVar14._4_4_;
      if (iVar6 <= iVar8 && (iVar6 != iVar8 || auVar14._0_4_ <= auVar10._0_4_)) {
        begin[uVar5 + 2] = iVar9 + 4;
        begin[uVar5 + 3] = iVar9 + 6;
      }
      uVar5 = uVar5 + 4;
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar12 + 4;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar12 + 4;
      iVar9 = iVar9 + 8;
      uVar7 = uVar4;
    } while (((ulong)uVar4 + 3 & 0xfffffffffffffffc) != uVar5);
  }
  if (nRegs < (int)uVar7) {
    __assert_fail("iVars <= nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x7e,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  iVar9 = sat_solver_addclause(pSat,begin,begin + uVar7);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  iVar8 = 0;
  if (iVar9 == 0) {
joined_r0x00629358:
    iVar8 = 1;
    if (fVerbose != 0) {
      iVar8 = 1;
      __s = "SAT solver became UNSAT after adding a uniqueness constraint.";
LAB_00629361:
      puts(__s);
    }
  }
  return iVar8;
}

Assistant:

int Saig_ManAddUniqueness( sat_solver * pSat, Vec_Int_t * vState, int nRegs, int i, int k, int * pnSatVarNum, int * pnClauses, int fVerbose )
{
    int * pStateI = (int *)Vec_IntArray(vState) + nRegs * i;
    int * pStateK = (int *)Vec_IntArray(vState) + nRegs * k;
    int v, iVars, nSatVarsOld, RetValue, * pClause;
    assert( i && k && i < k );
    assert( nRegs * k <= Vec_IntSize(vState) );
    // check if the states are available
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 && pStateK[v] == -1 )
        {
            if ( fVerbose )
                printf( "Cannot constrain an incomplete state.\n" );
            return 0;
        }
    // add XORs
    nSatVarsOld = *pnSatVarNum;
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 )
        {
            *pnClauses += 4;
            RetValue = Cnf_DataAddXorClause( pSat, pStateI[v], pStateK[v], (*pnSatVarNum)++ );
            if ( RetValue == 0 )
            {
                if ( fVerbose )
                    printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
                return 1;
            }
        }
    // add OR clause
    (*pnClauses)++;
    iVars = 0;
    pClause = ABC_ALLOC( int, nRegs );
    for ( v = nSatVarsOld; v < *pnSatVarNum; v++ )
        pClause[iVars++] = toLitCond( v, 0 );
    assert( iVars <= nRegs );
    RetValue = sat_solver_addclause( pSat, pClause, pClause + iVars );
    ABC_FREE( pClause );
    if ( RetValue == 0 )
    {
        if ( fVerbose )
            printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
        return 1;
    }
    return 0;
}